

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  WellTestCase<Well<unsigned_int,_32UL,_16UL,_0UL,_13UL,_9UL,_5UL,_Detail::M3<-16>,_Detail::M3<-15>,_Detail::M3<11>,_Detail::M0,_Detail::M3<-2>,_Detail::M3<-18>,_Detail::M2<-28>,_Detail::M5<-5,_3661901092U>,_Detail::NoTempering>,_725608862U>
  ::run();
  WellTestCase<Well<unsigned_int,_32UL,_17UL,_23UL,_13UL,_11UL,_10UL,_Detail::M3<-13>,_Detail::M3<-15>,_Detail::M1,_Detail::M2<-21>,_Detail::M3<-13>,_Detail::M2<1>,_Detail::M0,_Detail::M3<11>,_Detail::NoTempering>,_3381101411U>
  ::run();
  WellTestCase<Well<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_Detail::M3<-21>,_Detail::M3<6>,_Detail::M0,_Detail::M3<-13>,_Detail::M3<13>,_Detail::M2<-10>,_Detail::M2<-5>,_Detail::M3<13>,_Detail::NoTempering>,_3076024310U>
  ::run();
  WellTestCase<Well<unsigned_int,_32UL,_19UL,_1UL,_16UL,_15UL,_14UL,_Detail::M3<19>,_Detail::M3<11>,_Detail::M3<-14>,_Detail::M1,_Detail::M3<18>,_Detail::M1,_Detail::M0,_Detail::M3<-5>,_Detail::NoTempering>,_2068857834U>
  ::run();
  WellTestCase<Well<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_Detail::M3<-18>,_Detail::M3<-14>,_Detail::M0,_Detail::M3<18>,_Detail::M3<-24>,_Detail::M3<5>,_Detail::M3<-1>,_Detail::M0,_Detail::NoTempering>,_2933843930U>
  ::run();
  WellTestCase<Well<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_Detail::M1,_Detail::M3<-15>,_Detail::M3<10>,_Detail::M3<-11>,_Detail::M3<16>,_Detail::M2<20>,_Detail::M1,_Detail::M3<-28>,_Detail::NoTempering>,_738093167U>
  ::run();
  WellTestCase<Well<unsigned_int,_32UL,_25UL,_0UL,_9UL,_4UL,_22UL,_Detail::M3<-29>,_Detail::M2<-14>,_Detail::M1,_Detail::M2<19>,_Detail::M1,_Detail::M3<10>,_Detail::M4<3554951165U>,_Detail::M3<-25>,_Detail::NoTempering>,_4027179453U>
  ::run();
  WellTestCase<Well<unsigned_int,_32UL,_32UL,_0UL,_3UL,_24UL,_10UL,_Detail::M1,_Detail::M3<8>,_Detail::M3<-19>,_Detail::M3<-14>,_Detail::M3<-11>,_Detail::M3<-7>,_Detail::M3<-13>,_Detail::M0,_Detail::NoTempering>,_3498005132U>
  ::run();
  WellTestCase<Well<unsigned_int,_32UL,_32UL,_0UL,_22UL,_25UL,_26UL,_Detail::M3<-21>,_Detail::M3<17>,_Detail::M4<2346498334U>,_Detail::M3<15>,_Detail::M3<-14>,_Detail::M3<-21>,_Detail::M1,_Detail::M0,_Detail::NoTempering>,_2256501139U>
  ::run();
  WellTestCase<Well<unsigned_int,_32UL,_624UL,_31UL,_70UL,_179UL,_449UL,_Detail::M3<-25>,_Detail::M3<27>,_Detail::M2<9>,_Detail::M3<1>,_Detail::M1,_Detail::M3<-9>,_Detail::M3<-21>,_Detail::M3<21>,_Detail::NoTempering>,_3006934229U>
  ::run();
  WellTestCase<Well<unsigned_int,_32UL,_624UL,_31UL,_203UL,_613UL,_123UL,_Detail::M3<7>,_Detail::M1,_Detail::M3<12>,_Detail::M3<-10>,_Detail::M3<-19>,_Detail::M2<-11>,_Detail::M3<4>,_Detail::M3<-10>,_Detail::NoTempering>,_421390442U>
  ::run();
  WellTestCase<Well<unsigned_int,_32UL,_624UL,_31UL,_70UL,_179UL,_449UL,_Detail::M3<-25>,_Detail::M3<27>,_Detail::M2<9>,_Detail::M3<1>,_Detail::M1,_Detail::M3<-9>,_Detail::M3<-21>,_Detail::M3<21>,_Detail::MatsumotoKuritaTempering<3832420096U,_2609283072U>_>,_608087765U>
  ::run();
  WellTestCase<Well<unsigned_int,_32UL,_679UL,_27UL,_151UL,_327UL,_84UL,_Detail::M1,_Detail::M3<-26>,_Detail::M3<19>,_Detail::M0,_Detail::M3<27>,_Detail::M3<-11>,_Detail::M6<32UL,_15U,_2259277950U,_4294967279U,_2097152U>,_Detail::M3<-16>,_Detail::NoTempering>,_1936040553U>
  ::run();
  WellTestCase<Well<unsigned_int,_32UL,_726UL,_23UL,_667UL,_43UL,_462UL,_Detail::M3<28>,_Detail::M1,_Detail::M3<18>,_Detail::M3<3>,_Detail::M3<21>,_Detail::M3<-17>,_Detail::M3<-28>,_Detail::M3<-1>,_Detail::NoTempering>,_134732491U>
  ::run();
  WellTestCase<Well<unsigned_int,_32UL,_726UL,_23UL,_610UL,_175UL,_662UL,_Detail::M4<2831324881U>,_Detail::M1,_Detail::M6<32UL,_15U,_1567311308U,_4294901759U,_2U>,_Detail::M3<-24>,_Detail::M3<-26>,_Detail::M1,_Detail::M0,_Detail::M3<16>,_Detail::NoTempering>,_4054284113U>
  ::run();
  WellTestCase<Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<-24>,_Detail::M3<30>,_Detail::M3<-10>,_Detail::M2<-26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::NoTempering>,_4258775163U>
  ::run();
  WellTestCase<Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<-24>,_Detail::M3<30>,_Detail::M3<-10>,_Detail::M2<-26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>,_2483442811U>
  ::run();
  return 0;
}

Assistant:

int main() {
    CHECK_EQUAL(16, Detail::shift<2>(64));
    CHECK_EQUAL(64, Detail::shift<-2>(16));
    CHECK_EQUAL(32, Detail::shift<0>(32));
    CHECK(Detail::is_powerof2(512u));
    CHECK(!Detail::is_powerof2(0u));

#ifdef COLIRU
    std::cout << "WARNING: skipped majority of tests\n";
    Well44497a_ME()();
#else
    WellTestCase<Well512a,   0x2b3fe99e>::run();
    WellTestCase<Well521a,   0xc9878363>::run();
    WellTestCase<Well521b,   0xb75867f6>::run();
    WellTestCase<Well607a,   0x7b5043ea>::run();
    WellTestCase<Well607b,   0xaedee7da>::run();
    WellTestCase<Well800a,   0x2bfe686f>::run();
    WellTestCase<Well800b,   0xf009e1bd>::run();
    WellTestCase<Well1024a,  0xd07f528c>::run();
    WellTestCase<Well1024b,  0x867f7993>::run();
    WellTestCase<Well19937a, 0xb33a2cd5>::run();
    WellTestCase<Well19937b, 0x191de86a>::run();
    WellTestCase<Well19937c, 0x243eaed5>::run();
    WellTestCase<Well21701a, 0x7365a269>::run();
    WellTestCase<Well23209a, 0x807dacb >::run();
    WellTestCase<Well23209b, 0xf1a77751>::run();
    WellTestCase<Well44497a, 0xfdd7c07b>::run();
    WellTestCase<Well44497b, 0x9406547b>::run();
#endif
}